

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void remove_diffnon(saucy *s,int k)

{
  int iVar1;
  int j;
  int k_local;
  saucy *s_local;
  
  if (s->undiffnons[k] != -1) {
    iVar1 = s->ndiffnons + -1;
    s->ndiffnons = iVar1;
    iVar1 = s->diffnons[iVar1];
    s->diffnons[s->undiffnons[k]] = iVar1;
    s->undiffnons[iVar1] = s->undiffnons[k];
    s->undiffnons[k] = -1;
  }
  return;
}

Assistant:

static void
remove_diffnon(struct saucy *s, int k)
{
    int j;

    if (s->undiffnons[k] == -1) return;

    j = s->diffnons[--s->ndiffnons];
    s->diffnons[s->undiffnons[k]] = j;
    s->undiffnons[j] = s->undiffnons[k];

    s->undiffnons[k] = -1;
}